

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::CullingTest::iterate(CullingTest *this)

{
  ostringstream *poVar1;
  GLenum GVar2;
  pointer pVVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  char *pcVar7;
  uint uVar8;
  int vtxNdx;
  long lVar9;
  Vec4 *pVVar10;
  Vec4 *pVVar11;
  long lVar12;
  CullingTest *pCVar13;
  float fVar14;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_208;
  long local_1e8;
  Surface resultImage;
  SceneTriangle tri;
  RasterizationArguments local_48;
  
  iVar6 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar6,iVar6);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init((deRandom *)&tri,0x849ea);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&drawBuffer,6)
  ;
  lVar9 = 0;
  for (lVar12 = 0;
      lVar12 < (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar12 = lVar12 + 1) {
    fVar14 = deRandom_getFloat((deRandom *)&tri);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar9) =
         fVar14 * 1.8 + -0.9;
    fVar14 = deRandom_getFloat((deRandom *)&tri);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar9 + 4) =
         fVar14 * 1.8 + -0.9;
    *(undefined8 *)
     ((long)(drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar9 + 8) = 0x3f80000000000000;
    lVar9 = lVar9 + 0x10;
  }
  iVar6 = *(int *)&(this->super_BaseRenderingCase).field_0xc4;
  if (iVar6 != 0x408) {
    bVar4 = (iVar6 == 0x404) != (this->m_faceOrder == 0x901);
    GVar2 = this->m_primitive;
    if (GVar2 == 4) {
      iVar6 = 2;
      while( true ) {
        pVVar3 = drawBuffer.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = iVar6 - 2;
        if ((int)((ulong)((long)drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2 <= (int)uVar8)
        break;
        pCVar13 = (CullingTest *)
                  (drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar8);
        pVVar11 = drawBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar8 + 1;
        pVVar10 = drawBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar6;
        bVar5 = triangleOrder(pCVar13,pVVar11,pVVar10,(Vec4 *)(ulong)uVar8);
        if (bVar4 != bVar5) {
          tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
          tri.positions[0].m_data._0_8_ =
               (pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               _vptr_TestNode;
          tri.positions[0].m_data._8_8_ =
               (pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx;
          tri.sharedEdge[0] = false;
          tri.positions[1].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
          tri.positions[1].m_data._8_8_ = *(undefined8 *)(pVVar3[(long)(int)uVar8 + 1].m_data + 2);
          tri.sharedEdge[1] = false;
          tri.positions[2].m_data._0_8_ = *(undefined8 *)pVVar10->m_data;
          tri.positions[2].m_data._8_8_ = *(undefined8 *)(pVVar10->m_data + 2);
          tri.sharedEdge[2] = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_208,&tri);
        }
        iVar6 = iVar6 + 3;
      }
    }
    else if (GVar2 == 5) {
      local_1e8 = 0x200000000;
      lVar9 = 0x10;
      for (lVar12 = 0;
          pVVar3 = drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar12 < ((long)drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x200000000 >>
                   0x20; lVar12 = lVar12 + 1) {
        pVVar11 = (Vec4 *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar9);
        pCVar13 = (CullingTest *)
                  ((long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar9);
        pVVar10 = (Vec4 *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data +
                          (local_1e8 >> 0x1c));
        bVar5 = triangleOrder(pCVar13,pVVar11,pVVar10,(Vec4 *)0xfffffffe00000000);
        if (((uint)lVar12 & 1 ^ (uint)bVar4) != (uint)bVar5) {
          tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
          tri.positions[0].m_data._0_8_ =
               (pCVar13->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               _vptr_TestNode;
          tri.positions[0].m_data._8_8_ = *(undefined8 *)((long)pVVar3->m_data + lVar9 + -8);
          tri.sharedEdge[0] = false;
          tri.positions[1].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
          tri.positions[1].m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
          tri.sharedEdge[1] = false;
          tri.positions[2].m_data._0_8_ = *(undefined8 *)pVVar10->m_data;
          tri.positions[2].m_data._8_8_ = *(undefined8 *)(pVVar10->m_data + 2);
          tri.sharedEdge[2] = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_208,&tri);
        }
        local_1e8 = local_1e8 + 0x100000000;
        lVar9 = lVar9 + 0x10;
      }
    }
    else if (GVar2 == 6) {
      lVar12 = 0x20;
      for (lVar9 = 1;
          pVVar3 = drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar9 < ((long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >>
                  0x20; lVar9 = lVar9 + 1) {
        pVVar11 = (Vec4 *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
        pVVar10 = (Vec4 *)((long)drawBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar12);
        bVar5 = triangleOrder((CullingTest *)
                              drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,pVVar10,pVVar11,
                              (Vec4 *)0xffffffff00000000);
        if (bVar4 != bVar5) {
          tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
          tri.positions[0].m_data._0_8_ = *(undefined8 *)pVVar3->m_data;
          tri.positions[0].m_data._8_8_ = *(undefined8 *)(pVVar3->m_data + 2);
          tri.sharedEdge[0] = false;
          tri.positions[1].m_data._0_8_ = *(undefined8 *)pVVar10->m_data;
          tri.positions[1].m_data._8_8_ = *(undefined8 *)((long)pVVar3->m_data + lVar12 + -8);
          tri.sharedEdge[1] = false;
          tri.positions[2].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
          tri.positions[2].m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
          tri.sharedEdge[2] = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_208,&tri);
        }
        lVar12 = lVar12 + 0x10;
      }
    }
  }
  iVar6 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar9 + 0x5e0))(0xb44);
  (**(code **)(lVar9 + 0x418))(*(undefined4 *)&(this->super_BaseRenderingCase).field_0xc4);
  (**(code **)(lVar9 + 0x6c0))(this->m_faceOrder);
  tri.positions[0].m_data._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Setting front face to ");
  pcVar7 = glu::getWindingName(this->m_faceOrder);
  std::operator<<((ostream *)poVar1,pcVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tri.positions[0].m_data._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Setting cull face to ");
  pcVar7 = glu::getFaceName(*(int *)&(this->super_BaseRenderingCase).field_0xc4);
  std::operator<<((ostream *)poVar1,pcVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tri.positions[0].m_data._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Drawing test pattern (");
  pcVar7 = glu::getPrimitiveTypeName(this->m_primitive);
  std::operator<<((ostream *)poVar1,pcVar7);
  std::operator<<((ostream *)poVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&resultImage,&drawBuffer,this->m_primitive);
  local_48.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_48.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  local_48.redBits = (this->super_BaseRenderingCase).m_pixelFormat.redBits;
  local_48.greenBits = (this->super_BaseRenderingCase).m_pixelFormat.greenBits;
  local_48.blueBits = (this->super_BaseRenderingCase).m_pixelFormat.blueBits;
  tri.positions[0].m_data._0_8_ = local_208._M_impl.super__Vector_impl_data._M_start;
  tri.positions[0].m_data._8_8_ = local_208._M_impl.super__Vector_impl_data._M_finish;
  tri.positions[1].m_data._0_8_ = local_208._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar4 = tcu::verifyTriangleGroupRasterization
                    (&resultImage,(TriangleSceneSpec *)&tri,&local_48,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,VERIFICATIONMODE_WEAK);
  pcVar7 = "Incorrect rendering";
  if (bVar4) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (uint)!bVar4,pcVar7);
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&tri);
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base(&local_208);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  return STOP;
}

Assistant:

CullingTest::IterateResult CullingTest::iterate (void)
{
	tcu::Surface									resultImage(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	// draw image
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.enable(GL_CULL_FACE);
		gl.cullFace(m_cullMode);
		gl.frontFace(m_faceOrder);

		m_testCtx.getLog() << tcu::TestLog::Message << "Setting front face to " << glu::getWindingName(m_faceOrder) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting cull face to " << glu::getFaceName(m_cullMode) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing test pattern (" << glu::getPrimitiveTypeName(m_primitive) << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitive);
	}

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= getPixelFormat().redBits;
		args.greenBits		= getPixelFormat().greenBits;
		args.blueBits		= getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog(), tcu::VERIFICATIONMODE_WEAK))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rendering");
	}

	return STOP;
}